

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

bool Fossilize::write_string_to_file(char *path,char *text)

{
  int iVar1;
  FILE *__stream;
  bool bVar2;
  
  __stream = fopen(path,"w");
  if (__stream == (FILE *)0x0) {
    bVar2 = false;
  }
  else {
    iVar1 = fputs(text,__stream);
    bVar2 = iVar1 != -1;
    fclose(__stream);
  }
  return bVar2;
}

Assistant:

bool write_string_to_file(const char *path, const char *text)
{
	FILE *file = fopen(path, "w");
	if (!file)
		return false;

	if (fputs(text, file) == EOF)
	{
		fclose(file);
		return false;
	}

	fclose(file);
	return true;
}